

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetConfidentialTxOutByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **asset_string,
              int64_t *value_satoshi,char **value_commitment,char **nonce,char **locking_script,
              char **surjection_proof,char **rangeproof)

{
  bool *pbVar1;
  bool bVar2;
  int64_t iVar3;
  pointer pcVar4;
  CfdException *pCVar5;
  ulong uVar6;
  size_t sVar7;
  Amount AVar8;
  char *work_rangeproof;
  char *work_surjection_proof;
  char *work_locking_script;
  char *work_nonce;
  char *work_value_commitment;
  char *work_asset_string;
  ConfidentialValue value;
  ConfidentialTxOutReference ref;
  bool local_1e9;
  string local_1e8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 local_190 [16];
  _func_int *local_180 [5];
  void *local_158;
  ConfidentialValue local_150;
  ConfidentialTxOutReference local_128;
  
  local_198 = (char *)0x0;
  local_1a0 = (char *)0x0;
  local_1a8 = (char *)0x0;
  local_1b0 = (char *)0x0;
  local_1b8 = (char *)0x0;
  local_1c0 = (char *)0x0;
  local_158 = handle;
  cfd::Initialize();
  pbVar1 = &local_128.super_AbstractTxOutReference.value_.ignore_check_;
  local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_128);
  if (local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  local_1e9 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_1e9);
  if (*(ConfidentialTransaction **)((long)tx_data_handle + 0x18) != (ConfidentialTransaction *)0x0)
  {
    if (local_1e9 == true) {
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"Invalid handle state. tx is bitcoin.","");
      cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&local_128);
      __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    cfd::core::ConfidentialTransaction::GetTxOut
              (&local_128,*(ConfidentialTransaction **)((long)tx_data_handle + 0x18),index);
    if (asset_string != (char **)0x0) {
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_190,&local_128.asset_);
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)&local_150,(ConfidentialAssetId *)local_190);
      local_198 = cfd::capi::CreateString((string *)&local_150);
      if (local_150._vptr_ConfidentialValue !=
          (_func_int **)
          ((long)&local_150.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_150._vptr_ConfidentialValue);
      }
      local_190._0_8_ = &PTR__ConfidentialAssetId_00735710;
      if ((void *)CONCAT71(local_190._9_7_,local_190[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_190._9_7_,local_190[8]));
      }
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_150,&local_128.confidential_value_);
    if (value_satoshi != (int64_t *)0x0) {
      bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_150);
      if (!bVar2) {
        AVar8 = cfd::core::ConfidentialValue::GetAmount(&local_150);
        local_190._0_8_ = AVar8.amount_;
        local_190[8] = AVar8.ignore_check_;
        iVar3 = cfd::core::Amount::GetSatoshiValue((Amount *)local_190);
        *value_satoshi = iVar3;
      }
    }
    if (value_commitment != (char **)0x0) {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_190,&local_150);
      local_1a0 = cfd::capi::CreateString((string *)local_190);
      if ((_func_int **)local_190._0_8_ != local_180) {
        operator_delete((void *)local_190._0_8_);
      }
    }
    if (nonce != (char **)0x0) {
      cfd::core::ConfidentialNonce::ConfidentialNonce
                ((ConfidentialNonce *)local_190,&local_128.nonce_);
      cfd::core::ConfidentialNonce::GetHex_abi_cxx11_(&local_1e8,(ConfidentialNonce *)local_190);
      local_1a8 = cfd::capi::CreateString(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      local_190._0_8_ = &PTR__ConfidentialNonce_007356c0;
      if ((void *)CONCAT71(local_190._9_7_,local_190[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(local_190._9_7_,local_190[8]));
      }
    }
    if (locking_script != (char **)0x0) {
      cfd::core::Script::Script
                ((Script *)local_190,&local_128.super_AbstractTxOutReference.locking_script_);
      cfd::core::Script::GetHex_abi_cxx11_(&local_1e8,(Script *)local_190);
      local_1b0 = cfd::capi::CreateString(&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
      cfd::core::Script::~Script((Script *)local_190);
    }
    if (surjection_proof != (char **)0x0) {
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity = 0;
      uVar6 = (long)local_128.surjection_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_128.surjection_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar6 == 0) {
        pcVar4 = (pointer)0x0;
      }
      else {
        if ((long)uVar6 < 0) {
          std::__throw_bad_alloc();
        }
        pcVar4 = (pointer)operator_new(uVar6);
      }
      local_1e8.field_2._M_allocated_capacity = (size_type)(pcVar4 + uVar6);
      sVar7 = (long)local_128.surjection_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_128.surjection_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_1e8._M_dataplus._M_p = pcVar4;
      if (sVar7 != 0) {
        local_1e8._M_string_length = (size_type)pcVar4;
        memmove(pcVar4,local_128.surjection_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar7);
      }
      local_1e8._M_string_length = (size_type)(pcVar4 + sVar7);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_190,(ByteData *)&local_1e8);
      local_1b8 = cfd::capi::CreateString((string *)local_190);
      if ((_func_int **)local_190._0_8_ != local_180) {
        operator_delete((void *)local_190._0_8_);
      }
      if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
    }
    if (rangeproof != (char **)0x0) {
      local_1e8._M_dataplus._M_p = (pointer)0x0;
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_allocated_capacity = 0;
      uVar6 = (long)local_128.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_128.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      if (uVar6 == 0) {
        pcVar4 = (pointer)0x0;
      }
      else {
        if ((long)uVar6 < 0) {
          std::__throw_bad_alloc();
        }
        pcVar4 = (pointer)operator_new(uVar6);
      }
      local_1e8.field_2._M_allocated_capacity = (size_type)(pcVar4 + uVar6);
      sVar7 = (long)local_128.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_128.range_proof_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_1e8._M_dataplus._M_p = pcVar4;
      if (sVar7 != 0) {
        local_1e8._M_string_length = (size_type)pcVar4;
        memmove(pcVar4,local_128.range_proof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar7);
      }
      local_1e8._M_string_length = (size_type)(pcVar4 + sVar7);
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_190,(ByteData *)&local_1e8);
      local_1c0 = cfd::capi::CreateString((string *)local_190);
      if ((_func_int **)local_190._0_8_ != local_180) {
        operator_delete((void *)local_190._0_8_);
      }
      if (local_1e8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_1e8._M_dataplus._M_p);
      }
    }
    if (local_198 != (char *)0x0) {
      *asset_string = local_198;
    }
    if (local_1a0 != (char *)0x0) {
      *value_commitment = local_1a0;
    }
    if (local_1a8 != (char *)0x0) {
      *nonce = local_1a8;
    }
    if (local_1b0 != (char *)0x0) {
      *locking_script = local_1b0;
    }
    if (local_1b8 != (char *)0x0) {
      *surjection_proof = local_1b8;
    }
    if (local_1c0 != (char *)0x0) {
      *rangeproof = local_1c0;
    }
    local_150._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if (local_150.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_128);
    return 0;
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_128.super_AbstractTxOutReference._vptr_AbstractTxOutReference = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&local_128);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** asset_string,
    int64_t* value_satoshi, char** value_commitment, char** nonce,
    char** locking_script, char** surjection_proof, char** rangeproof) {
  char* work_asset_string = nullptr;
  char* work_value_commitment = nullptr;
  char* work_nonce = nullptr;
  char* work_locking_script = nullptr;
  char* work_surjection_proof = nullptr;
  char* work_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxOutReference ref = tx->GetTxOut(index);

    if (asset_string != nullptr) {
      work_asset_string = CreateString(ref.GetAsset().GetHex());
    }
    ConfidentialValue value = ref.GetConfidentialValue();
    if ((value_satoshi != nullptr) && (!value.HasBlinding())) {
      *value_satoshi = value.GetAmount().GetSatoshiValue();
    }
    if (value_commitment != nullptr) {
      work_value_commitment = CreateString(value.GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(ref.GetNonce().GetHex());
    }
    if (locking_script != nullptr) {
      work_locking_script = CreateString(ref.GetLockingScript().GetHex());
    }
    if (surjection_proof != nullptr) {
      work_surjection_proof = CreateString(ref.GetSurjectionProof().GetHex());
    }
    if (rangeproof != nullptr) {
      work_rangeproof = CreateString(ref.GetRangeProof().GetHex());
    }

    if (work_asset_string != nullptr) *asset_string = work_asset_string;
    if (work_value_commitment != nullptr)
      *value_commitment = work_value_commitment;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_surjection_proof != nullptr)
      *surjection_proof = work_surjection_proof;
    if (work_rangeproof != nullptr) *rangeproof = work_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_asset_string, &work_value_commitment, &work_nonce,
        &work_locking_script, &work_surjection_proof, &work_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}